

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

void fy_emit_mapping_key_prolog
               (fy_emitter *emit,fy_emit_save_ctx *sc,fy_token *fyt_key,_Bool simple_key)

{
  _Bool _Var1;
  _Bool simple_key_local;
  fy_token *fyt_key_local;
  fy_emit_save_ctx *sc_local;
  fy_emitter *emit_local;
  
  sc->flags = sc->flags & 0x10U | 4;
  if (((simple_key) && (sc->flags = sc->flags | 8, fyt_key != (fy_token *)0x0)) &&
     (fyt_key->type == FYTT_SCALAR)) {
    sc->flags = sc->flags | 0x40;
  }
  _Var1 = fy_emit_is_oneline(emit);
  if (!_Var1) {
    fy_emit_write_indent(emit,sc->indent);
  }
  if ((sc->flags & 8U) == 0) {
    fy_emit_write_indicator(emit,di_question_mark,sc->flags,sc->indent,fyewt_indicator);
  }
  return;
}

Assistant:

static void fy_emit_mapping_key_prolog(struct fy_emitter *emit, struct fy_emit_save_ctx *sc,
                                       struct fy_token *fyt_key, bool simple_key) {
    sc->flags = DDNF_MAP | (sc->flags & DDNF_FLOW);

    if (simple_key) {
        sc->flags |= DDNF_SIMPLE;
        if (fyt_key && fyt_key->type == FYTT_SCALAR)
            sc->flags |= DDNF_SIMPLE_SCALAR_KEY;
    }

    if (!fy_emit_is_oneline(emit))
        fy_emit_write_indent(emit, sc->indent);

    /* complex? */
    if (!(sc->flags & DDNF_SIMPLE))
        fy_emit_write_indicator(emit, di_question_mark, sc->flags, sc->indent, fyewt_indicator);
}